

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_4U>::resample
          (ImageT<unsigned_char,_4U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  Color *pCVar1;
  format_args args;
  string_view fmt;
  byte bVar2;
  uint uVar3;
  pointer pIVar4;
  uint *puVar5;
  runtime_error *this_00;
  char *pcVar6;
  pointer pRVar7;
  byte *pbVar8;
  reference pvVar9;
  reference pvVar10;
  value_type pfVar11;
  reference ppfVar12;
  uchar *puVar13;
  int in_ECX;
  int iVar14;
  uint in_EDX;
  long in_RSI;
  v10 *this_01;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  float fVar15;
  uchar unormValue;
  float outValue;
  float linearValue;
  uint32_t c_3;
  Color *targetPixel;
  uint32_t targetX;
  uint32_t c_2;
  array<const_float_*,_4UL> outputLine;
  uint32_t c_1;
  float value;
  uint32_t c;
  Color *sourcePixel;
  uint32_t sourceX;
  uint32_t sourceY;
  uint32_t targetY;
  TransferFunction *tf;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  uint32_t i;
  bool isHDR;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_4UL> samples;
  uint32_t sourceHeight;
  uint32_t sourceWidth;
  __single_object target;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *in_stack_fffffffffffffc48;
  array<std::vector<float,_std::allocator<float>_>,_4UL> *in_stack_fffffffffffffc50;
  unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
  *in_stack_fffffffffffffc58;
  array<std::vector<float,_std::allocator<float>_>,_4UL> *in_stack_fffffffffffffc60;
  Contrib_List **__new_size;
  uint *in_stack_fffffffffffffc70;
  vector<float,_std::allocator<float>_> *this_02;
  uint *in_stack_fffffffffffffc78;
  uint *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  uint *in_stack_fffffffffffffca0;
  uchar local_34f;
  uchar local_34e;
  uchar local_34d;
  long *local_348;
  float *in_stack_fffffffffffffcc0;
  float *in_stack_fffffffffffffcc8;
  char **in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  value_type in_stack_fffffffffffffcdc;
  Contrib_List **in_stack_fffffffffffffce0;
  long *plVar16;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  float *in_stack_fffffffffffffcf0;
  float *in_stack_fffffffffffffcf8;
  float *in_stack_fffffffffffffd00;
  Contrib_List *local_2e0;
  Contrib_List *local_2d0;
  bool local_299;
  uint local_26c;
  uint local_260;
  uint local_25c;
  undefined1 local_258 [36];
  uint local_234;
  float local_230;
  uint local_22c;
  color<unsigned_char,_4U> *local_228;
  uint local_21c;
  uint local_218;
  int local_214;
  long *local_210;
  long local_208;
  long local_200;
  uint local_1f8;
  Boundary_Op local_1f4;
  Contrib_List *local_1f0;
  undefined1 local_1e8 [12];
  undefined8 local_1dc;
  uint local_1d0;
  undefined1 local_1c9;
  float local_1c8 [32];
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar17;
  undefined4 uVar18;
  char *pcVar19;
  size_t in_stack_fffffffffffffed0;
  uint local_10c;
  uint local_108 [7];
  undefined1 local_ec [12];
  int local_e0;
  uint local_dc [5];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_a0;
  char *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_90;
  undefined1 local_88 [16];
  int *local_78;
  char *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_20;
  undefined8 local_18;
  undefined8 *local_10;
  char *local_8;
  
  local_e0 = in_ECX;
  local_dc[0] = in_EDX;
  std::make_unique<ImageT<unsigned_char,4u>,unsigned_int&,unsigned_int&>
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                       *)0x1fb543);
  Image::setTransferFunction(&pIVar4->super_Image,*(khr_df_transfer_e *)(in_RSI + 0x10));
  pIVar4 = std::
           unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>::
           operator->((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                       *)0x1fb565);
  Image::setPrimaries(&pIVar4->super_Image,*(khr_df_primaries_e *)(in_RSI + 0x14));
  local_108[0] = *(uint *)(in_RSI + 8);
  local_10c = *(uint *)(in_RSI + 0xc);
  local_299 = false;
  if (((local_108[0] != 0) && (local_299 = false, local_10c != 0)) &&
     (local_299 = false, local_dc[0] != 0)) {
    local_299 = local_e0 != 0;
  }
  if (local_299) {
    this_01 = (v10 *)&local_10c;
    puVar5 = std::max<unsigned_int>(local_108,(uint *)this_01);
    if (*puVar5 < 0x4001) {
      this_01 = (v10 *)&local_e0;
      puVar5 = std::max<unsigned_int>(local_dc,(uint *)this_01);
      if (*puVar5 < 0x4001) {
        std::array<std::vector<float,_std::allocator<float>_>,_4UL>::array
                  (in_stack_fffffffffffffc60);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
        ::array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                 *)in_stack_fffffffffffffc60);
        local_1c9 = 0;
        for (local_1d0 = 0; local_1d0 < 4; local_1d0 = local_1d0 + 1) {
          local_1dc._0_4_ = 0;
          local_1e8._8_4_ = 0x3f800000;
          if (local_1d0 == 0) {
            local_2d0 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x1fb9ac);
            local_2d0 = basisu::Resampler::get_clist_x(pRVar7);
          }
          local_1e8._0_8_ = local_2d0;
          if (local_1d0 == 0) {
            local_2e0 = (Contrib_List *)0x0;
          }
          else {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x1fba0f);
            local_2e0 = basisu::Resampler::get_clist_y(pRVar7);
          }
          local_1f0 = local_2e0;
          local_1f4 = BOUNDARY_WRAP;
          local_1f8 = 0;
          this_02 = (vector<float,_std::allocator<float>_> *)local_ec;
          __new_size = &local_1f0;
          in_stack_fffffffffffffc60 =
               (array<std::vector<float,_std::allocator<float>_>,_4UL> *)local_1e8;
          in_stack_fffffffffffffc58 =
               (unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                *)(local_ec + 4);
          in_stack_fffffffffffffc50 =
               (array<std::vector<float,_std::allocator<float>_>,_4UL> *)(local_1e8 + 8);
          in_stack_fffffffffffffc48 =
               (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)&local_1dc;
          std::
          make_unique<basisu::Resampler,unsigned_int_const&,unsigned_int_const&,unsigned_int&,unsigned_int&,basisu::Resampler::Boundary_Op&,float,float,char_const*&,basisu::Resampler::Contrib_List*,basisu::Resampler::Contrib_List*,float&,float&,float,float>
                    (in_stack_fffffffffffffca0,
                     (uint *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                     in_stack_fffffffffffffc90,&local_1f8,&local_1f4,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,
                     (Contrib_List **)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffce0,
                     (float *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                     in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd00 = local_1c8;
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                      *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
          in_stack_fffffffffffffcf8 = (float *)((long)&local_1dc + 4);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator=
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc50);
          std::
          array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>::
          operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                      *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     in_stack_fffffffffffffc50);
          checkResamplerStatus
                    ((Resampler *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     (char *)in_stack_fffffffffffffcd0);
          std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                    (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
          std::vector<float,_std::allocator<float>_>::resize(this_02,(size_type)__new_size);
        }
        TransferFunctionSRGB::TransferFunctionSRGB
                  ((TransferFunctionSRGB *)in_stack_fffffffffffffc50);
        TransferFunctionLinear::TransferFunctionLinear
                  ((TransferFunctionLinear *)in_stack_fffffffffffffc50);
        if (*(int *)(in_RSI + 0x10) == 2) {
          local_210 = &local_200;
        }
        else {
          local_210 = &local_208;
        }
        local_214 = 0;
        for (local_218 = 0; local_218 < local_10c; local_218 = local_218 + 1) {
          for (local_21c = 0; local_21c < local_108[0]; local_21c = local_21c + 1) {
            local_228 = (color<unsigned_char,_4U> *)
                        (*(long *)(in_RSI + 0x18) +
                        (ulong)(local_218 * local_108[0] + local_21c) * 4);
            for (local_22c = 0; local_22c < 4; local_22c = local_22c + 1) {
              pbVar8 = color<unsigned_char,_4U>::operator[](local_228,local_22c);
              fVar15 = (float)*pbVar8;
              bVar2 = color_base<unsigned_char,_4U>::one();
              local_230 = fVar15 * (1.0 / (float)bVar2);
              plVar16 = local_210;
              if (local_22c == 3) {
                plVar16 = &local_208;
              }
              in_stack_fffffffffffffcdc = (value_type)(**(code **)(*plVar16 + 8))(local_230);
              pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                                 (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
              pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (pvVar9,(ulong)local_21c);
              *pvVar10 = in_stack_fffffffffffffcdc;
            }
          }
          for (local_234 = 0; local_234 < 4; local_234 = local_234 + 1) {
            std::
            array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
            ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                          *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
            pRVar7 = std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
                     operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                 *)0x1fbe3a);
            pvVar9 = std::array<std::vector<float,_std::allocator<float>_>,_4UL>::operator[]
                               (in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
            std::vector<float,_std::allocator<float>_>::operator[](pvVar9,0);
            bVar2 = basisu::Resampler::put_line((float *)pRVar7);
            in_stack_fffffffffffffcd8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffcd8);
            if ((bVar2 & 1) == 0) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                            *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::operator*
                        ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         in_stack_fffffffffffffc50);
              checkResamplerStatus
                        ((Resampler *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         (char *)pRVar7);
            }
          }
          while( true ) {
            memset(local_258,0,0x20);
            for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
              std::
              array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
              ::operator[]((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                            *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48);
              std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::
              operator->((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                         0x1fbf2e);
              pfVar11 = (value_type)basisu::Resampler::get_line();
              ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                   ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc50,
                                    (size_type)in_stack_fffffffffffffc48);
              *ppfVar12 = pfVar11;
            }
            ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                 ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc50,
                                  (size_type)in_stack_fffffffffffffc48);
            if (*ppfVar12 == (value_type)0x0) break;
            for (local_260 = 0; local_260 < local_dc[0]; local_260 = local_260 + 1) {
              pIVar4 = std::
                       unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                       ::operator->((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                                     *)0x1fbfb6);
              pCVar1 = pIVar4->pixels;
              iVar14 = local_214 * local_dc[0];
              for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
                ppfVar12 = std::array<const_float_*,_4UL>::operator[]
                                     ((array<const_float_*,_4UL> *)in_stack_fffffffffffffc50,
                                      (size_type)in_stack_fffffffffffffc48);
                if (local_26c == 3) {
                  local_348 = &local_208;
                }
                else {
                  local_348 = local_210;
                }
                fVar15 = (float)(**(code **)*local_348)((*ppfVar12)[local_260]);
                uVar3 = std::isnan((double)(ulong)(uint)fVar15);
                if ((uVar3 & 1) == 0) {
                  if (0.0 <= fVar15) {
                    if (fVar15 <= 1.0) {
                      bVar2 = color_base<unsigned_char,_4U>::one();
                      local_34f = (uchar)(int)(fVar15 * (float)bVar2 + 0.5);
                    }
                    else {
                      local_34f = color_base<unsigned_char,_4U>::one();
                    }
                    local_34e = local_34f;
                  }
                  else {
                    local_34e = '\0';
                  }
                  local_34d = local_34e;
                }
                else {
                  local_34d = '\0';
                }
                puVar13 = color<unsigned_char,_4U>::operator[]
                                    (pCVar1 + (iVar14 + local_260),local_26c);
                *puVar13 = local_34d;
              }
            }
            local_214 = local_214 + 1;
          }
        }
        std::unique_ptr<Image,std::default_delete<Image>>::
        unique_ptr<ImageT<unsigned_char,4u>,std::default_delete<ImageT<unsigned_char,4u>>,void>
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffc58);
        TransferFunctionLinear::~TransferFunctionLinear((TransferFunctionLinear *)0x1fc1d0);
        TransferFunctionSRGB::~TransferFunctionSRGB((TransferFunctionSRGB *)0x1fc1dd);
        std::array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
        ::~array((array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL>
                  *)in_stack_fffffffffffffc60);
        std::array<std::vector<float,_std::allocator<float>_>,_4UL>::~array
                  (in_stack_fffffffffffffc60);
        std::unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
        ::~unique_ptr((unique_ptr<ImageT<unsigned_char,_4U>,_std::default_delete<ImageT<unsigned_char,_4U>_>_>
                       *)in_stack_fffffffffffffc50);
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (tuple<Image_*,_std::default_delete<Image>_>)
               in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      }
    }
    uVar17 = CONCAT13(1,(int3)in_stack_fffffffffffffeb8);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = &stack0xfffffffffffffec0;
    local_70 = "Image larger than max supported size of {}";
    local_60 = "Image larger than max supported size of {}";
    pcVar19 = "Image larger than max supported size of {}";
    local_58 = local_68;
    pcVar6 = (char *)std::char_traits<char>::length((char_type *)0x1fb6eb);
    local_8 = local_70;
    uVar18 = 0x4000;
    local_78 = (int *)&stack0xfffffffffffffed0;
    local_90 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
               &stack0xfffffffffffffebc;
    local_50 = local_88;
    local_a0 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )pcVar19;
    local_98 = pcVar6;
    local_48 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )pcVar19;
    pcStack_40 = pcVar6;
    local_c8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                            (local_90,this_01,local_78);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_18 = 1;
    local_b0 = 1;
    fmt.size_ = in_stack_fffffffffffffed0;
    fmt.data_ = pcVar6;
    args.desc_._4_4_ = uVar18;
    args.desc_._0_4_ = uVar17;
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar19;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    local_a8 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(fmt,args);
    std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffed0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 4>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 4]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }